

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O2

void WjTestLib_AddTest(WJTL_UNIT_TEST_FUNCTION TestFunction,char *TestName)

{
  bool bVar1;
  byte bVar2;
  WJTL_STATUS WVar3;
  WjtlTestList *pWVar4;
  char *pcVar5;
  WjtlTestList *pWVar6;
  WJTL_UNIT_TEST_FUNCTION unaff_RBX;
  WjtlGroupList **ppWVar7;
  long lVar8;
  WjtlGroupList *unaff_R12;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t auStack_70 [3];
  WJTL_UNIT_TEST_FUNCTION p_Stack_58;
  WjtlGroupList *pWStack_50;
  
  if ((TestFunction != (WJTL_UNIT_TEST_FUNCTION)0x0) && (TestName != (char *)0x0)) {
    if (gGroupListTail == (WjtlGroupList *)0x0) {
      WjTestLib_NewGroup("Default");
      unaff_R12 = gGroupListTail;
      if (gGroupListTail == (WjtlGroupList *)0x0) goto LAB_0011d1a3;
    }
    unaff_R12 = gGroupListTail;
    pWVar4 = (WjtlTestList *)calloc(1,0x50);
    if (pWVar4 != (WjtlTestList *)0x0) {
      pcVar5 = strdup(TestName);
      pWVar4->TestName = pcVar5;
      if (pcVar5 != (char *)0x0) {
        pWVar4->TestFunction = TestFunction;
        pWVar6 = (WjtlTestList *)&unaff_R12->TestListHead;
        if (unaff_R12->TestListTail != (WjtlTestList *)0x0) {
          pWVar6 = unaff_R12->TestListTail;
        }
        pWVar6->Next = pWVar4;
        unaff_R12->TestListTail = pWVar4;
        return;
      }
    }
    InternalError("Memory fail");
    unaff_RBX = TestFunction;
  }
  TestFunction = unaff_RBX;
  InternalError("Invalid parameters");
LAB_0011d1a3:
  InternalError("Failed to create default group");
  ppWVar7 = &gGroupListHead;
  bVar1 = false;
  bVar2 = 0;
  p_Stack_58 = TestFunction;
  pWStack_50 = unaff_R12;
  while (ppWVar7 = &((WjtlGroupList *)ppWVar7)->Next->Next,
        (WjtlGroupList *)ppWVar7 != (WjtlGroupList *)0x0) {
    printf(":::::::: Test Group : %s ::::::::\n",((WjtlGroupList *)ppWVar7)->GroupName);
    pWVar4 = (WjtlTestList *)&((WjtlGroupList *)ppWVar7)->TestListHead;
    while (pWVar4 = pWVar4->Next, pWVar4 != (WjtlTestList *)0x0) {
      printf(":::: Test : %s ::::\n",pWVar4->TestName);
      auStack_70[0] = 0;
      auStack_70[2] = 0;
      uStack_78 = 0;
      uStack_80 = 0;
      auStack_70[1] = 0;
      uStack_88 = 0;
      uStack_90 = 0;
      uStack_98 = 0;
      WjTestLib_Memory_GetStats(auStack_70,auStack_70 + 2,&uStack_78);
      WjTestLib_Asserts_Reset();
      WVar3 = (*pWVar4->TestFunction)();
      WjTestLib_Memory_GetStats(&uStack_80,auStack_70 + 1,&uStack_88);
      WjTestLib_Asserts_GetStats(&uStack_90,&uStack_98);
      pWVar4->TestStatus = WVar3;
      pWVar4->NumAsserts = uStack_90;
      pWVar4->NumFailedAsserts = uStack_98;
      if (uStack_98 != 0) {
        printf("#### %lu Assert fails in test: %s\n",uStack_98,pWVar4->TestName);
      }
      pWVar4->NumAllocations = uStack_80 - auStack_70[0];
      lVar8 = uStack_88 - uStack_78;
      pWVar4->NumMemLeaks = lVar8;
      if (lVar8 != 0) {
        printf("#### %lu Memory leaks in test: %s\n",lVar8,pWVar4->TestName);
      }
      bVar2 = 1;
      ((WjtlGroupList *)ppWVar7)->GroupRun = true;
      pWVar4->TestRun = true;
    }
    bVar1 = true;
  }
  if (!(bool)(bVar2 & bVar1)) {
    pcVar5 = "No group named: %s\n";
    if (bVar1) {
      pcVar5 = "No test named: %s\n";
    }
    printf(pcVar5,0);
  }
  return;
}

Assistant:

void
    WjTestLib_AddTest
    (
        WJTL_UNIT_TEST_FUNCTION     TestFunction,
        char const*                 TestName
    )
{
    if(     NULL != TestFunction
        &&  NULL != TestName )
    {
        if( NULL == gGroupListTail )
        {
            // No group created yet, so make a default one
            WjTestLib_NewGroup( "Default" );
        }

        if( NULL != gGroupListTail )
        {
            WjtlTestList* newTest = calloc( 1, sizeof(WjtlTestList) );
            if( NULL != newTest )
            {
                newTest->TestName = strdup( TestName );
                if( NULL != newTest->TestName )
                {
                    newTest->NumAllocations = 0;
                    newTest->NumDeallocations = 0;
                    newTest->NumAsserts = 0;
                    newTest->NumFailedAsserts = 0;
                    newTest->TestFunction = TestFunction;
                    newTest->Next = NULL;

                    if( NULL == gGroupListTail->TestListTail )
                    {
                        gGroupListTail->TestListHead = newTest;
                    }
                    else
                    {
                        gGroupListTail->TestListTail->Next = newTest;
                    }
                    gGroupListTail->TestListTail = newTest;
                }
                else
                {
                    InternalError( "Memory fail" );
                }
            }
            else
            {
                InternalError( "Memory fail" );
            }
        }
        else
        {
            InternalError( "Failed to create default group" );
        }
    }
    else
    {
        InternalError( "Invalid parameters" );
    }
}